

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_get_byoffset_raw(fdb_kvs_handle *handle,fdb_doc *doc)

{
  docio_length len;
  bool bVar1;
  int64_t iVar2;
  size_t sVar3;
  ulong *in_RSI;
  long in_RDI;
  fdb_kvs_id_t kv_id;
  int64_t _offset;
  docio_object _doc;
  uint64_t offset;
  bool in_stack_00000087;
  docio_object *in_stack_00000088;
  uint64_t in_stack_00000090;
  docio_handle *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c;
  uint8_t in_stack_ffffffffffffff7d;
  uint8_t in_stack_ffffffffffffff7e;
  uint8_t in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  void *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  long local_68;
  ushort local_58;
  ushort uStack_56;
  uint uStack_54;
  undefined4 local_50;
  uint uStack_4c;
  void *local_40;
  ulong local_38;
  void *local_30;
  void *local_28;
  ulong local_20;
  ulong *local_18;
  long local_10;
  fdb_status local_4;
  
  if (in_RDI == 0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RSI == (ulong *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    local_20 = in_RSI[6];
    local_18 = in_RSI;
    local_10 = in_RDI;
    docio_object::docio_object
              ((docio_object *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if ((local_20 == 0) || (local_20 == 0xffffffffffffffff)) {
      local_4 = FDB_RESULT_INVALID_ARGS;
    }
    else {
      bVar1 = atomic_cas_uint8_t((atomic<unsigned_char> *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e);
      if (bVar1) {
        atomic_incr_uint64_t
                  ((atomic<unsigned_long> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   CONCAT13(in_stack_ffffffffffffff7f,
                            CONCAT12(in_stack_ffffffffffffff7e,
                                     CONCAT11(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff7c)))
                  );
        memset(&local_58,0,0x38);
        iVar2 = docio_read_doc(in_stack_00000098,in_stack_00000090,in_stack_00000088,
                               in_stack_00000087);
        if (((iVar2 < 1) || (local_40 == (void *)0x0)) || ((uStack_4c & 0x10) != 0)) {
          atomic_cas_uint8_t((atomic<unsigned_char> *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e);
          if (iVar2 < 0) {
            local_4 = (fdb_status)iVar2;
          }
          else {
            local_4 = FDB_RESULT_KEY_NOT_FOUND;
          }
        }
        else {
          if (*(long *)(local_10 + 0x18) != 0) {
            buf2kvid(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (fdb_kvs_id_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
            if (local_68 != *(long *)(*(long *)(local_10 + 0x18) + 8)) {
              atomic_cas_uint8_t((atomic<unsigned_char> *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e);
              free_docio_object((docio_object *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e,
                                in_stack_ffffffffffffff7d);
              return FDB_RESULT_KEY_NOT_FOUND;
            }
            _remove_kv_id((fdb_kvs_handle *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (docio_object *)
                          CONCAT17(in_stack_ffffffffffffff7f,
                                   CONCAT16(in_stack_ffffffffffffff7e,
                                            CONCAT15(in_stack_ffffffffffffff7d,
                                                     CONCAT14(in_stack_ffffffffffffff7c,
                                                              in_stack_ffffffffffffff78)))));
          }
          local_18[5] = local_38;
          *local_18 = (ulong)local_58;
          local_18[1] = (ulong)uStack_56;
          local_18[2] = (ulong)uStack_54;
          if (local_18[4] == 0) {
            local_18[4] = (ulong)local_40;
          }
          else {
            free(local_40);
          }
          if (local_18[7] == 0) {
            local_18[7] = (ulong)local_30;
          }
          else {
            free(local_30);
          }
          if (local_18[8] == 0) {
            local_18[8] = (ulong)local_28;
          }
          else {
            if (uStack_54 != 0) {
              memcpy((void *)local_18[8],local_28,(ulong)uStack_54);
            }
            free(local_28);
          }
          *(bool *)(local_18 + 9) = (uStack_4c & 4) != 0;
          len.metalen = uStack_56;
          len.keylen = local_58;
          len.bodylen = uStack_54;
          len.flag = (undefined1)uStack_4c;
          len.checksum = uStack_4c._1_1_;
          len.reserved = uStack_4c._2_2_;
          len.bodylen_ondisk = local_50;
          sVar3 = _fdb_get_docsize(len);
          local_18[3] = sVar3;
          if (*(long *)(local_10 + 0x18) != 0) {
            local_18[3] = (ulong)*(ushort *)(local_10 + 0x70) + local_18[3];
          }
          if ((uStack_4c & 4) == 0) {
            atomic_cas_uint8_t((atomic<unsigned_char> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e);
            local_4 = FDB_RESULT_SUCCESS;
          }
          else {
            atomic_cas_uint8_t((atomic<unsigned_char> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e);
            local_4 = FDB_RESULT_KEY_NOT_FOUND;
          }
        }
      }
      else {
        local_4 = FDB_RESULT_HANDLE_BUSY;
      }
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_byoffset_raw(fdb_kvs_handle *handle, fdb_doc *doc)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc) {
        return FDB_RESULT_INVALID_ARGS;
    }

    uint64_t offset = doc->offset;
    struct docio_object _doc;

    if (!offset || offset == BLK_NOT_FOUND) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);
    memset(&_doc, 0, sizeof(struct docio_object));

    int64_t _offset = docio_read_doc(handle->dhandle, offset, &_doc, true);
    if (_offset <= 0 || !_doc.key || (_doc.length.flag & DOCIO_TXN_COMMITTED)) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
    }

    if (handle->kvs) {
        fdb_kvs_id_t kv_id;
        buf2kvid(handle->config.chunksize, _doc.key, &kv_id);
        if (kv_id != handle->kvs->id) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            free_docio_object(&_doc, 1, 1, 1);
            return FDB_RESULT_KEY_NOT_FOUND;
        }
        _remove_kv_id(handle, &_doc);
    }

    doc->seqnum = _doc.seqnum;
    doc->keylen = _doc.length.keylen;
    doc->metalen = _doc.length.metalen;
    doc->bodylen = _doc.length.bodylen;
    if (doc->key) {
        free(_doc.key);
    } else {
        doc->key = _doc.key;
    }
    if (doc->meta) {
        free(_doc.meta);
    } else {
        doc->meta = _doc.meta;
    }
    if (doc->body) {
        if (_doc.length.bodylen > 0) {
            memcpy(doc->body, _doc.body, _doc.length.bodylen);
        }
        free(_doc.body);
    } else {
        doc->body = _doc.body;
    }
    doc->deleted = _doc.length.flag & DOCIO_DELETED;
    doc->size_ondisk = _fdb_get_docsize(_doc.length);
    if (handle->kvs) {
        // Since _doc.length was adjusted in _remove_kv_id(),
        // we need to compensate it.
        doc->size_ondisk += handle->config.chunksize;
    }

    if (_doc.length.flag & DOCIO_DELETED) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_KEY_NOT_FOUND;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}